

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OgreBinarySerializer.cpp
# Opt level: O2

uint16_t __thiscall
Assimp::Ogre::OgreBinarySerializer::ReadHeader(OgreBinarySerializer *this,bool readLen)

{
  uint16_t uVar1;
  uint32_t uVar2;
  undefined3 in_register_00000031;
  
  uVar1 = Read<unsigned_short>(this);
  if (CONCAT31(in_register_00000031,readLen) != 0) {
    uVar2 = Read<unsigned_int>(this);
    this->m_currentLen = uVar2;
  }
  return uVar1;
}

Assistant:

uint16_t OgreBinarySerializer::ReadHeader(bool readLen)
{
    uint16_t id = Read<uint16_t>();
    if (readLen)
        m_currentLen = Read<uint32_t>();

#if (OGRE_BINARY_SERIALIZER_DEBUG == 1)
    if (id != HEADER_CHUNK_ID)
    {
        ASSIMP_LOG_DEBUG(Formatter::format() << (assetMode == AM_Mesh
            ? MeshHeaderToString(static_cast<MeshChunkId>(id)) : SkeletonHeaderToString(static_cast<SkeletonChunkId>(id))));
    }
#endif

    return id;
}